

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

RangeCoverageBinInitializerSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::RangeCoverageBinInitializerSyntax,slang::syntax::RangeListSyntax&,slang::syntax::WithClauseSyntax*&>
          (BumpAllocator *this,RangeListSyntax *args,WithClauseSyntax **args_1)

{
  WithClauseSyntax *withClause;
  RangeListSyntax *in_RDX;
  RangeCoverageBinInitializerSyntax *in_RSI;
  BumpAllocator *in_RDI;
  
  withClause = (WithClauseSyntax *)allocate(in_RDI,(size_t)in_RSI,(size_t)in_RDX);
  slang::syntax::RangeCoverageBinInitializerSyntax::RangeCoverageBinInitializerSyntax
            (in_RSI,in_RDX,withClause);
  return (RangeCoverageBinInitializerSyntax *)withClause;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }